

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O1

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,Access *access)

{
  shared_ptr<mcc::Token> *token;
  element_type *peVar1;
  ErrorReporter *pEVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int iVar4;
  Entry *pEVar5;
  string local_48;
  
  peVar1 = (access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->return_ptr_ = true;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  bVar3 = Type::IsStruct(&((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->type_);
  if (!bVar3) {
    bVar3 = Type::IsUnion(&((access->name_).
                            super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_
                         );
    if (!bVar3) {
      pEVar2 = this->reporter_;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Only struct/union fields can be accessed via \'.\' or \'->\' operator","");
      ErrorReporter::Report(pEVar2,&local_48,&(access->super_Expr).op_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  token = &(access->super_Expr).op_;
  if ((((access->super_Expr).op_.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       ->token_type_ == T_DOT) &&
     ((((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).
      ind != 0)) {
    pEVar2 = this->reporter_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Struct variable expected, but got pointer","");
    ErrorReporter::Report(pEVar2,&local_48,token);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((token->super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->token_type_ ==
       T_ARROW) &&
     ((((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).
      ind != 1)) {
    pEVar2 = this->reporter_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Pointer to struct expected","");
    ErrorReporter::Report(pEVar2,&local_48,token);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (*((access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expr[3])();
  if ((char)iVar4 == '\0') {
    pEVar2 = this->reporter_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Only string fields are supported","");
    ErrorReporter::Report
              (pEVar2,&local_48,
               &((access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->op_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  (access->super_Expr).is_lvalue_ = true;
  peVar1 = (access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (access->field_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  pEVar5 = SymbolTable::GetField
                     (this->symbol_table_,
                      &((access->name_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->type_,
                      &((peVar1->op_).super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->identifier_);
  if (pEVar5 == (Entry *)0x0) {
    pEVar2 = this->reporter_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Undefined field","");
    ErrorReporter::Report(pEVar2,&local_48,&peVar1->op_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    Type::operator=(&(access->super_Expr).type_,pEVar5->type);
    Type::operator=(&peVar1->type_,pEVar5->type);
    peVar1->offset_ = pEVar5->offset;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void TypeChecker::Visit(Access& access) {
  access.name_->return_ptr_ = true;
  access.name_->Accept(*this);

  if (!access.name_->type_.IsStruct() && !access.name_->type_.IsUnion()) {
    reporter_.Report("Only struct/union fields can be accessed via '.' or '->' operator", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_DOT && access.name_->type_.ind != 0) {
    reporter_.Report("Struct variable expected, but got pointer", access.op_);
  }

  if (access.op_->GetType() == TokenType::T_ARROW && access.name_->type_.ind != 1) {
    reporter_.Report("Pointer to struct expected", access.op_);
  }

  if (!access.field_->IsVariable()) {
    reporter_.Report("Only string fields are supported", access.field_->op_);
  }

  access.is_lvalue_ = true;
  const std::shared_ptr<Literal>& field = std::static_pointer_cast<Literal>(access.field_);
  Entry* field_ = symbol_table_.GetField(access.name_->type_, field->op_->String());

  if (field_ == nullptr) {
    reporter_.Report("Undefined field", field->op_);
    return;
  }

  access.type_ = *field_->type;
  field->type_ = *field_->type;
  field->offset_ = field_->offset; // annotate node with offset value
}